

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O3

void __thiscall
xemmai::t_type_of<xemmai::t_module>::f_do_instantiate
          (t_type_of<xemmai::t_module> *this,t_pvalue *a_stack,size_t a_n)

{
  t_type *ptVar1;
  t_object *ptVar2;
  wchar_t *extraout_RDX;
  wstring_view a_message;
  undefined1 in_stack_00000020 [16];
  
  if (a_n == 1) {
    ptVar2 = a_stack[2].super_t_pointer.v_p;
    if ((((t_object *)0x4 < ptVar2) && (ptVar1 = ptVar2->v_type, ptVar1->v_depth != 0)) &&
       ((undefined8 *)ptVar1->v_ids[1] == &v__type_id<xemmai::t_string>)) {
      ptVar2 = t_module::f_instantiate((wstring_view)in_stack_00000020);
      (a_stack->super_t_pointer).v_p = ptVar2;
      return;
    }
    f_do_instantiate();
    a_n = (size_t)extraout_RDX;
  }
  a_message._M_str = (wchar_t *)a_n;
  a_message._M_len = (size_t)L"must be called with an argument.";
  f_throw((xemmai *)0x20,a_message);
}

Assistant:

void t_type_of<t_module>::f_do_instantiate(t_pvalue* a_stack, size_t a_n)
{
	if (a_n != 1) f_throw(L"must be called with an argument."sv);
	f_check<t_string>(a_stack[2], L"argument0");
	a_stack[0] = t_module::f_instantiate(a_stack[2]->f_as<t_string>());
}